

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O3

void Js::JavascriptArray::MergeSort<short>
               (short *list,uint32 length,CompareVarsInfo *cvInfo,ArenaAllocator *allocator)

{
  _func_bool_CompareVarsInfo_ptr_void_ptr_void_ptr *p_Var1;
  code *pcVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  bool bVar6;
  BOOL BVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  undefined4 *puVar11;
  char *pcVar12;
  uint uVar14;
  uint uVar15;
  long lVar16;
  uint uVar17;
  long lVar18;
  short *psVar19;
  ulong local_70;
  short local_34;
  short local_32 [4];
  short rightElement;
  ulong uVar13;
  
  if (length != 0) {
    p_Var1 = cvInfo->compareType;
    BVar7 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar7 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar11 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                  "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar6) goto LAB_00ba0c9f;
      *puVar11 = 0;
    }
    pcVar12 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
              AllocInternal(&allocator->
                             super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                            ,(ulong)length * 2);
    if (pcVar12 == (char *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar11 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar6) {
LAB_00ba0c9f:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar11 = 0;
    }
    if (2 < length * 2) {
      uVar10 = 2;
      uVar5 = 1;
      do {
        uVar8 = uVar10;
        if (length != 0) {
          uVar15 = 0;
          uVar10 = uVar5;
          do {
            uVar9 = uVar5 + uVar15;
            uVar13 = (ulong)uVar9;
            if (uVar9 < length) {
              local_70 = (ulong)(uVar9 - 1);
              psVar19 = list + local_70;
              bVar6 = (*p_Var1)(cvInfo,list + uVar13,psVar19);
              if (bVar6) {
                uVar14 = uVar15 + uVar8;
                if (length <= uVar15 + uVar8) {
                  uVar14 = length;
                }
                uVar17 = 0xffffffff;
                if (uVar9 < uVar14) {
                  lVar18 = 0;
                  do {
                    *(short *)(pcVar12 + lVar18 * 2) = list[(ulong)uVar10 + lVar18];
                    lVar16 = (ulong)uVar10 + lVar18;
                    lVar18 = lVar18 + 1;
                  } while (lVar16 + 1U < (ulong)uVar14);
                  uVar13 = (ulong)(uVar10 + (int)lVar18);
                  uVar17 = (int)lVar18 - 1;
                }
                local_32[0] = *(short *)(pcVar12 + (ulong)uVar17 * 2);
                while( true ) {
                  local_34 = *psVar19;
                  iVar3 = (int)uVar13;
                  uVar9 = iVar3 - 3;
                  lVar18 = 0;
                  while( true ) {
                    lVar16 = (ulong)uVar17 + lVar18;
                    bVar6 = (*p_Var1)(cvInfo,local_32,&local_34);
                    iVar4 = (int)lVar18;
                    uVar14 = (iVar3 - 1U) + iVar4;
                    if (bVar6) break;
                    list[uVar14] = local_32[0];
                    if ((uint)lVar16 == 0) goto LAB_00ba0c5d;
                    local_32[0] = *(short *)(pcVar12 + (ulong)((uVar17 - 1) + iVar4) * 2);
                    lVar18 = lVar18 + -1;
                    uVar9 = uVar9 - 1;
                  }
                  list[uVar14] = local_34;
                  if ((uint)local_70 <= uVar15) break;
                  local_70 = (ulong)((uint)local_70 - 1);
                  psVar19 = list + local_70;
                  uVar13 = (ulong)(iVar3 - 1U) + lVar18 & 0xffffffff;
                  uVar17 = (uint)lVar16;
                }
                list[(iVar3 + iVar4) - 2] = local_32[0];
                if (uVar17 + iVar4 != 0) {
                  do {
                    uVar13 = (ulong)uVar9;
                    uVar9 = uVar9 - 1;
                    list[uVar13] = *(short *)(pcVar12 + lVar16 * 2 + -2);
                    lVar16 = lVar16 + -1;
                  } while (lVar16 != 0);
                }
              }
            }
LAB_00ba0c5d:
            uVar15 = uVar15 + uVar8;
            uVar10 = uVar10 + uVar8;
          } while (uVar15 < length);
        }
        uVar10 = uVar8 * 2;
        uVar5 = uVar8;
      } while (uVar8 * 2 < length * 2);
    }
  }
  return;
}

Assistant:

void JavascriptArray::MergeSort(T* list, uint32 length, JavascriptArray::CompareVarsInfo* cvInfo, ArenaAllocator* allocator)
    {
        bool (*compareType)(JavascriptArray::CompareVarsInfo*, const void*, const void*) = cvInfo->compareType;
        T* buffer = AnewArray(allocator, T, length);
        uint32 bucketSize = 2, lastSize = 1, position = 0, left = 0, mid = 0, right = 0, i = 0, j = 0, k = 0;
        uint32 doubleLength = length + length;
        T rightElement, leftElement;

        while (bucketSize < doubleLength)
        {
            while (position < length)
            {
                left = position;
                mid = left + lastSize;

                // perform a merge but only if it's necessary
                if (mid < length && compareType (cvInfo, &list[mid], &list[mid - 1]))
                {
                    right = position + bucketSize;
                    right = right < length ? right : length;
                    i = mid - 1, j = 0, k = mid;

                    while (k < right)
                    {
                        buffer[j++] = list[k++];
                    }
    
                    rightElement = buffer[--j];
                    leftElement = list[i];

                    for (;;)
                    {
                        if (compareType (cvInfo, &rightElement, &leftElement))
                        {
                            list[--k] = leftElement;
                            if (i > left)
                            {
                                leftElement = list[--i];
                            }
                            else
                            {
                                list[--k] = rightElement;
                                break;
                            }
                        }
                        else
                        {
                            list[--k] = rightElement;
                            if (j > 0)
                            {
                                rightElement = buffer[--j];
                            }
                            else
                            {
                                break;
                            }
                        }
                    }

                    while (j > 0)
                    {
                        list[--k] = buffer[--j];
                    }
                }  
                position += bucketSize;
            }
            position = 0;
            lastSize = bucketSize;
            bucketSize *= 2;
        }
    }